

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          Symbol **args_1,SmallVector<int,_10UL> *args_2)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  uint uVar4;
  ushort uVar5;
  group_type_pointer pgVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  value_type_pointer local_48;
  
  pgVar6 = __return_storage_ptr__->pg;
  uVar7 = (ulong)__return_storage_ptr__->n;
  local_48 = __return_storage_ptr__->p;
  lVar8 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar9[0] = -(pgVar2->m[0].n == '\0');
    auVar9[1] = -(pgVar2->m[1].n == '\0');
    auVar9[2] = -(pgVar2->m[2].n == '\0');
    auVar9[3] = -(pgVar2->m[3].n == '\0');
    auVar9[4] = -(pgVar2->m[4].n == '\0');
    auVar9[5] = -(pgVar2->m[5].n == '\0');
    auVar9[6] = -(pgVar2->m[6].n == '\0');
    auVar9[7] = -(pgVar2->m[7].n == '\0');
    auVar9[8] = -(pgVar2->m[8].n == '\0');
    auVar9[9] = -(pgVar2->m[9].n == '\0');
    auVar9[10] = -(pgVar2->m[10].n == '\0');
    auVar9[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar9[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar9[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar9[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar9[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar5 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe;
    if (uVar5 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar4 = 0;
      if (uVar5 != 0) {
        for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar7 = (ulong)uVar4;
      ppVar3 = arrays_->elements_;
      local_48 = ppVar3 + pos0 * 0xf + uVar7;
      local_48->first = *args_1;
      slang::SmallVector<int,_10UL>::SmallVector
                (&ppVar3[pos0 * 0xf + uVar7].second,&args_2->super_SmallVectorBase<int>);
      pgVar1->m[uVar7].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar6 = pgVar1;
    }
    if (uVar5 != 0) break;
    pos0 = pos0 + lVar8 & arrays_->groups_size_mask;
    lVar8 = lVar8 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar7;
  __return_storage_ptr__->p = local_48;
  __return_storage_ptr__->pg = pgVar6;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }